

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
          (char *expected_expression,char *actual_expression,iterator *expected,iterator *actual)

{
  iterator other;
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  char *in_RCX;
  iterator *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  BasicProblem<mp::BasicProblemParams<int>_> *in_RDI;
  string *in_R8;
  AssertionResult AVar5;
  iterator *in_stack_ffffffffffffff60;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar6;
  string local_78 [32];
  string local_58 [39];
  string *actual_value;
  iterator *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  unique0x00012000 = *(undefined8 *)in_R8;
  actual_value = (string *)in_R8->_M_string_length;
  other.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._8_8_ =
       in_RDI;
  other.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
       = in_RDI;
  pBVar6 = in_RDI;
  bVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::iterator::operator==(in_stack_ffffffffffffff60,other);
  if (bVar3) {
    AVar5 = AssertionSuccess();
    sVar4 = AVar5.message_.ptr_;
  }
  else {
    expected_expression_00 = in_RDX;
    FormatForComparisonFailureMessage<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
              ((iterator *)in_RDI,in_RDX);
    FormatForComparisonFailureMessage<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
              ((iterator *)in_RDI,in_RDX);
    uVar2 = stack0xffffffffffffffc8;
    uVar1 = (ulong)stack0xffffffffffffffc8 >> 0x38;
    bVar3 = SUB81(uVar1,0);
    unique0x10000155 = uVar2;
    EqFailure((char *)expected_expression_00,in_RCX,in_R8,actual_value,bVar3);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
    sVar4.ptr_ = extraout_RDX;
  }
  AVar5.message_.ptr_ = sVar4.ptr_;
  AVar5._0_8_ = pBVar6;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}